

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropertyComputer.cxx
# Opt level: O0

bool cmTargetPropertyComputer::PassesWhitelist
               (TargetType tgtType,string *prop,cmMessenger *messenger,cmListFileBacktrace *context)

{
  bool bVar1;
  ostream *poVar2;
  string local_1d0;
  ostringstream local_1a0 [8];
  ostringstream e;
  cmListFileBacktrace *context_local;
  cmMessenger *messenger_local;
  string *prop_local;
  TargetType tgtType_local;
  
  if ((tgtType == INTERFACE_LIBRARY) && (bVar1 = WhiteListedInterfaceProperty(prop), !bVar1)) {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar2 = std::operator<<((ostream *)local_1a0,
                             "INTERFACE_LIBRARY targets may only have whitelisted properties.  The property \""
                            );
    poVar2 = std::operator<<(poVar2,(string *)prop);
    std::operator<<(poVar2,"\" is not allowed.");
    std::__cxx11::ostringstream::str();
    cmMessenger::IssueMessage(messenger,FATAL_ERROR,&local_1d0,context);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
    return false;
  }
  return true;
}

Assistant:

bool cmTargetPropertyComputer::PassesWhitelist(
  cmStateEnums::TargetType tgtType, std::string const& prop,
  cmMessenger* messenger, cmListFileBacktrace const& context)
{
  if (tgtType == cmStateEnums::INTERFACE_LIBRARY &&
      !WhiteListedInterfaceProperty(prop)) {
    std::ostringstream e;
    e << "INTERFACE_LIBRARY targets may only have whitelisted properties.  "
         "The property \""
      << prop << "\" is not allowed.";
    messenger->IssueMessage(cmake::FATAL_ERROR, e.str(), context);
    return false;
  }
  return true;
}